

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetAccessors
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,Var *getter,
          Var *setter)

{
  uint16 uVar1;
  PropertyIndex PVar2;
  TypePath *this_00;
  ObjectSlotAttributes **ppOVar3;
  Var pvVar4;
  uchar **ppuVar5;
  PropertyIndex propertyIndex;
  Var *setter_local;
  Var *getter_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  this_00 = PathTypeHandlerBase::GetTypePath((PathTypeHandlerBase *)this);
  uVar1 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this);
  PVar2 = TypePath::LookupInline(this_00,propertyId,(uint)uVar1);
  if (PVar2 == 0xffff) {
    this_local._4_4_ = 0;
  }
  else {
    ppOVar3 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                        ((WriteBarrierPtr *)&this->attributes);
    if (((*ppOVar3)[PVar2] & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
      this_local._4_4_ = 0;
    }
    else {
      pvVar4 = DynamicObject::GetSlot(instance,(uint)PVar2);
      *getter = pvVar4;
      ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                          ((WriteBarrierPtr *)&this->setters);
      pvVar4 = DynamicObject::GetSlot(instance,(uint)(*ppuVar5)[PVar2]);
      *setter = pvVar4;
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetAccessors(DynamicObject* instance, PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter)
    {
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            return false;
        }
        if (!(attributes[propertyIndex] & ObjectSlotAttr_Accessor))
        {
            return false;
        }
        *getter = instance->GetSlot(propertyIndex);
        *setter = instance->GetSlot(setters[propertyIndex]);
        return true;
    }